

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_unlock(int mutex,int proc)

{
  undefined4 *puVar1;
  undefined4 in_ESI;
  undefined4 in_EDI;
  int unaff_retaddr;
  header_t *header;
  
  puVar1 = (undefined4 *)_my_malloc(0);
  *puVar1 = 0x13;
  *(undefined8 *)(puVar1 + 2) = 0;
  *(undefined8 *)(puVar1 + 4) = 0;
  puVar1[6] = in_EDI;
  *(undefined8 *)(puVar1 + 8) = 0;
  _mq_push(unaff_retaddr,(char *)CONCAT44(in_EDI,in_ESI),(int)((ulong)puVar1 >> 0x20));
  _make_progress_if_needed();
  return 0;
}

Assistant:

int comex_unlock(int mutex, int proc)
{
#if DEBUG
    printf("[%d] comex_unlock id=%d proc=%d\n", l_state.rank, mutex, proc);
#endif

    header_t *header = NULL;
    header = _my_malloc(sizeof(header_t));
    header->operation = OP_UNLOCK;
    header->remote_address = NULL;
    header->local_address = NULL;
    header->length = mutex;
    header->notify_address = NULL;

    _mq_push(proc, (char*)header, sizeof(header_t));
    _make_progress_if_needed();

    return COMEX_SUCCESS;
}